

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVector<llvm::SMFixIt,_4U>::~SmallVector(SmallVector<llvm::SMFixIt,_4U> *this)

{
  SMFixIt *S;
  
  S = (SMFixIt *)
      (this->super_SmallVectorImpl<llvm::SMFixIt>).
      super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
      super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
  SmallVectorTemplateBase<llvm::SMFixIt,_false>::destroy_range
            (S,S + (this->super_SmallVectorImpl<llvm::SMFixIt>).
                   super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
                   super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size);
  SmallVectorImpl<llvm::SMFixIt>::~SmallVectorImpl(&this->super_SmallVectorImpl<llvm::SMFixIt>);
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }